

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1chord_angle.h
# Opt level: O3

void __thiscall S1ChordAngle::S1ChordAngle(S1ChordAngle *this,S2Point *x,S2Point *y)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  S2LogMessage SStack_28;
  
  bVar1 = S2::IsUnitLength(x);
  if (bVar1) {
    bVar1 = S2::IsUnitLength(y);
    if (bVar1) {
      dVar4 = x->c_[1] - y->c_[1];
      dVar2 = x->c_[0] - y->c_[0];
      dVar3 = x->c_[2] - y->c_[2];
      dVar2 = dVar3 * dVar3 + dVar4 * dVar4 + dVar2 * dVar2;
      if (4.0 <= dVar2) {
        dVar2 = 4.0;
      }
      this->length2_ = dVar2;
      bVar1 = is_valid(this);
      if (bVar1) {
        return;
      }
      S2LogMessage::S2LogMessage
                (&SStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.h"
                 ,0xf0,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_28.stream_,"Check failed: is_valid() ",0x19);
    }
    else {
      S2LogMessage::S2LogMessage
                (&SStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.h"
                 ,0xec,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_28.stream_,"Check failed: S2::IsUnitLength(y) ",0x22);
    }
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.h"
               ,0xeb,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Check failed: S2::IsUnitLength(x) ",0x22);
  }
  abort();
}

Assistant:

inline S1ChordAngle::S1ChordAngle(const S2Point& x, const S2Point& y) {
  S2_DCHECK(S2::IsUnitLength(x));
  S2_DCHECK(S2::IsUnitLength(y));
  // The squared distance may slightly exceed 4.0 due to roundoff errors.
  // The maximum error in the result is 2 * DBL_EPSILON * length2_.
  length2_ = std::min(4.0, (x - y).Norm2());
  S2_DCHECK(is_valid());
}